

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::iterate(GeometryShader_gl_in_ArrayLengthTest *this)

{
  ostringstream *this_00;
  Case *pCVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int *piVar5;
  MessageBuilder *this_01;
  NotSupportedError *this_02;
  char *description;
  qpTestResult testResult;
  TestContext *this_03;
  _Elt_pointer ppCVar6;
  _Map_pointer local_1c0;
  _Elt_pointer local_1b8;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x299);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_buffer_object_id);
  ppCVar6 = (this->m_tests).
            super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_1b8 = (this->m_tests).
              super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1c0 = (this->m_tests).
              super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  do {
    if (ppCVar6 ==
        (this->m_tests).
        super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      this_03 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00cdf9bb:
      tcu::TestContext::setTestResult(this_03,testResult,description);
      return STOP;
    }
    pCVar1 = *ppCVar6;
    (**(code **)(lVar4 + 0x1680))(pCVar1->po_id);
    (**(code **)(lVar4 + 0x30))(pCVar1->tf_mode);
    (**(code **)(lVar4 + 0x538))(pCVar1->draw_call_mode,0,pCVar1->draw_call_n_vertices);
    (**(code **)(lVar4 + 0x638))();
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error doing a draw call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2b0);
    piVar5 = (int *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,4,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not map the buffer object into process space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2b6);
    iVar2 = *piVar5;
    (**(code **)(lVar4 + 0x1670))(0x8c8e);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error unmapping the buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x2be);
    if (iVar2 != pCVar1->expected_array_length) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Expected array length: ");
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,&pCVar1->expected_array_length);
      std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " but found: ");
      std::ostream::operator<<(&this_01->m_str,iVar2);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_03 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00cdf9bb;
    }
    ppCVar6 = ppCVar6 + 1;
    if (ppCVar6 == local_1b8) {
      ppCVar6 = local_1c0[1];
      local_1c0 = local_1c0 + 1;
      local_1b8 = ppCVar6 + 0x40;
    }
  } while( true );
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_in_ArrayLengthTest::iterate()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Setup transform feedback */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_object_id);

	/* Execute tests */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		glw::GLint result_value = 0;
		Case*	  test			= *it;

		/* Execute */
		gl.useProgram(test->po_id);

		gl.beginTransformFeedback(test->tf_mode);
		{
			gl.drawArrays(test->draw_call_mode, 0, /* first */
						  test->draw_call_n_vertices);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error doing a draw call");

		/* Map transform feedback results */
		glw::GLint* result = (glw::GLint*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */,
															sizeof(glw::GLint), GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map the buffer object into process space");

		/* Extract value from transform feedback */
		result_value = *result;

		/* Unmap transform feedback buffer */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping the buffer object");

		/* Verify results */
		if (result_value != test->expected_array_length)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Expected array length: " << test->expected_array_length
							   << " but found: " << result_value << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}